

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void tun_flushwrite(handler *h)

{
  void *in_RDI;
  ringbuf_visitor unaff_retaddr;
  tunif *tun;
  
  ringbuf_pop((ringbuf *)tun,unaff_retaddr,in_RDI);
  return;
}

Assistant:

void tun_flushwrite(struct handler * h)
{
  struct tunif * tun = &h->t->tun;
  ringbuf_pop(&tun->write, &tun_ringbuf_write, tun);
}